

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DebugNodeDrawList(ImGuiWindow *window,ImDrawList *draw_list,char *label)

{
  uint uVar1;
  ImGuiWindow *pIVar2;
  ImDrawVert *pIVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  ImDrawList *this;
  ImDrawCmd *pIVar10;
  long lVar11;
  char *pcVar12;
  byte bVar13;
  uint uVar14;
  ulong uVar15;
  unsigned_short *puVar16;
  uint uVar17;
  char *pcVar18;
  ImDrawCmd *draw_cmd;
  int iVar19;
  long lVar20;
  float fVar21;
  ImGuiListClipper clipper;
  ImVec2 local_190;
  ImVec2 triangle_1 [3];
  char buf [300];
  undefined1 local_3c [12];
  
  pIVar4 = GImGui;
  iVar19 = (draw_list->CmdBuffer).Size;
  lVar20 = (long)iVar19;
  if (0 < lVar20) {
    pIVar10 = (draw_list->CmdBuffer).Data;
    if (pIVar10[lVar20 + -1].ElemCount == 0) {
      iVar19 = iVar19 - (uint)(pIVar10[lVar20 + -1].UserCallback == (ImDrawCallback)0x0);
    }
  }
  pcVar18 = "";
  if (draw_list->_OwnerName != (char *)0x0) {
    pcVar18 = draw_list->_OwnerName;
  }
  bVar5 = TreeNode(draw_list,"%s: \'%s\' %d vtx, %d indices, %d cmds",label,pcVar18,
                   (ulong)(uint)(draw_list->VtxBuffer).Size,(ulong)(uint)(draw_list->IdxBuffer).Size
                   ,iVar19);
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->DrawList == draw_list) {
    SameLine(0.0,-1.0);
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = -0x80;
    buf[3] = '?';
    buf[4] = -0x33;
    buf[5] = -0x34;
    buf[6] = -0x34;
    buf[7] = '>';
    buf[8] = -0x33;
    buf[9] = -0x34;
    buf[10] = -0x34;
    buf[0xb] = '>';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = -0x80;
    buf[0xf] = '?';
    TextColored((ImVec4 *)buf,"CURRENTLY APPENDING");
    if (!bVar5) {
      return;
    }
  }
  else {
    this = GetForegroundDrawList();
    if (window == (ImGuiWindow *)0x0) {
      if (!bVar5) {
        return;
      }
    }
    else {
      bVar6 = IsItemHovered(0);
      if (bVar6) {
        buf._4_4_ = (window->Size).y + (window->Pos).y;
        buf._0_4_ = (window->Size).x + (window->Pos).x;
        ImDrawList::AddRect(this,&window->Pos,(ImVec2 *)buf,0xff00ffff,0.0,0xf,1.0);
      }
      if (!bVar5) {
        return;
      }
      if (window->WasActive == false) {
        TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");
      }
    }
    pIVar10 = (draw_list->CmdBuffer).Data;
    for (draw_cmd = pIVar10; draw_cmd < pIVar10 + iVar19; draw_cmd = draw_cmd + 1) {
      if (draw_cmd->UserCallback == (ImDrawCallback)0x0) {
        ImFormatString(buf,300,"DrawCmd:%5d tris, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                       SUB84((double)(draw_cmd->ClipRect).x,0),
                       SUB84((double)(draw_cmd->ClipRect).y,0),(double)(draw_cmd->ClipRect).z,
                       (double)(draw_cmd->ClipRect).w,(ulong)draw_cmd->ElemCount / 3,
                       draw_cmd->TextureId);
        bVar5 = TreeNode((void *)(((long)draw_cmd - (long)(draw_list->CmdBuffer).Data) / 0x38),"%s",
                         buf);
        bVar6 = IsItemHovered(0);
        if (bVar6) {
          bVar6 = (pIVar4->DebugMetricsConfig).ShowDrawCmdMesh;
          if (bVar6 == false) {
            bVar13 = (pIVar4->DebugMetricsConfig).ShowDrawCmdBoundingBoxes;
            if ((this != (ImDrawList *)0x0 & bVar13) != 0) goto LAB_0012a59d;
          }
          else if (this != (ImDrawList *)0x0) {
            bVar13 = (pIVar4->DebugMetricsConfig).ShowDrawCmdBoundingBoxes;
LAB_0012a59d:
            DebugNodeDrawCmdShowMeshAndBoundingBox(this,draw_list,draw_cmd,bVar6,(bool)(bVar13 & 1))
            ;
          }
        }
        if (bVar5) {
          if ((draw_list->IdxBuffer).Size < 1) {
            puVar16 = (unsigned_short *)0x0;
          }
          else {
            puVar16 = (draw_list->IdxBuffer).Data;
          }
          uVar1 = draw_cmd->VtxOffset;
          uVar14 = draw_cmd->IdxOffset;
          pIVar3 = (draw_list->VtxBuffer).Data;
          uVar7 = draw_cmd->ElemCount + uVar14;
          fVar21 = 0.0;
          for (; uVar14 < uVar7; uVar14 = uVar14 + 3) {
            clipper.ItemsFrozen = 0;
            clipper.ItemsHeight = 0.0;
            clipper.DisplayStart = 0;
            clipper.DisplayEnd = 0;
            clipper.ItemsCount = 0;
            clipper.StepNo = 0;
            for (lVar20 = 0; lVar20 != 3; lVar20 = lVar20 + 1) {
              uVar17 = (uint)((ulong)uVar14 + lVar20);
              if (puVar16 != (unsigned_short *)0x0) {
                uVar17 = (uint)puVar16[(ulong)uVar14 + lVar20 & 0xffffffff];
              }
              *(ImVec2 *)(&clipper.DisplayStart + lVar20 * 2) =
                   pIVar3[(ulong)uVar1 + (ulong)uVar17].pos;
            }
            fVar21 = fVar21 + ABS(((float)clipper.DisplayEnd - (float)clipper.StepNo) *
                                  (float)clipper.ItemsFrozen +
                                  ((float)clipper.StepNo - clipper.ItemsHeight) *
                                  (float)clipper.DisplayStart +
                                  (clipper.ItemsHeight - (float)clipper.DisplayEnd) *
                                  (float)clipper.ItemsCount) * 0.5;
          }
          ImFormatString(buf,300,
                         "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px",
                         SUB84((double)fVar21,0));
          clipper.DisplayStart = 0;
          clipper.DisplayEnd = 0;
          Selectable(buf,false,0,(ImVec2 *)&clipper);
          bVar5 = IsItemHovered(0);
          if (this != (ImDrawList *)0x0 && bVar5) {
            DebugNodeDrawCmdShowMeshAndBoundingBox(this,draw_list,draw_cmd,true,false);
          }
          ImGuiListClipper::ImGuiListClipper(&clipper);
          ImGuiListClipper::Begin(&clipper,draw_cmd->ElemCount / 3,-1.0);
          while (bVar5 = ImGuiListClipper::Step(&clipper), bVar5) {
            uVar15 = (ulong)(clipper.DisplayStart * 3 + draw_cmd->IdxOffset);
            for (iVar9 = clipper.DisplayStart; iVar9 < clipper.DisplayEnd; iVar9 = iVar9 + 1) {
              triangle_1[0].x = 0.0;
              triangle_1[0].y = 0.0;
              triangle_1[1].x = 0.0;
              triangle_1[1].y = 0.0;
              triangle_1[2].x = 0.0;
              triangle_1[2].y = 0.0;
              pcVar18 = buf;
              for (lVar20 = 0; lVar20 != 3; lVar20 = lVar20 + 1) {
                if (puVar16 == (unsigned_short *)0x0) {
                  uVar14 = (int)uVar15 + (int)lVar20;
                }
                else {
                  uVar14 = (uint)puVar16[(int)uVar15 + lVar20];
                }
                lVar11 = (long)(int)uVar14;
                triangle_1[lVar20] = pIVar3[(ulong)uVar1 + lVar11].pos;
                pcVar12 = "     ";
                if (lVar20 == 0) {
                  pcVar12 = "Vert:";
                }
                iVar8 = ImFormatString(pcVar18,(size_t)(local_3c + -(long)pcVar18),
                                       "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                       SUB84((double)pIVar3[(ulong)uVar1 + lVar11].pos.x,0),
                                       SUB84((double)pIVar3[(ulong)uVar1 + lVar11].pos.y,0),
                                       (double)pIVar3[(ulong)uVar1 + lVar11].uv.x,
                                       (double)pIVar3[(ulong)uVar1 + lVar11].uv.y,pcVar12,
                                       (uVar15 & 0xffffffff) + lVar20,
                                       (ulong)pIVar3[(ulong)uVar1 + lVar11].col);
                pcVar18 = pcVar18 + iVar8;
              }
              local_190.x = 0.0;
              local_190.y = 0.0;
              Selectable(buf,false,0,&local_190);
              if ((this != (ImDrawList *)0x0) && (bVar5 = IsItemHovered(0), bVar5)) {
                uVar14 = this->Flags;
                this->Flags = uVar14 & 0xfffffffe;
                ImDrawList::AddPolyline(this,triangle_1,3,0xff00ffff,true,1.0);
                this->Flags = uVar14;
              }
              uVar15 = (uVar15 & 0xffffffff) + 3;
            }
          }
          TreePop();
          ImGuiListClipper::~ImGuiListClipper(&clipper);
        }
      }
      else {
        BulletText("Callback %p, user_data %p",draw_cmd->UserCallback,draw_cmd->UserCallbackData);
      }
      pIVar10 = (draw_list->CmdBuffer).Data;
    }
  }
  TreePop();
  return;
}

Assistant:

void ImGui::DebugNodeDrawList(ImGuiWindow* window, const ImDrawList* draw_list, const char* label)
{
    ImGuiContext& g = *GImGui;
    ImGuiMetricsConfig* cfg = &g.DebugMetricsConfig;
    int cmd_count = draw_list->CmdBuffer.Size;
    if (cmd_count > 0 && draw_list->CmdBuffer.back().ElemCount == 0 && draw_list->CmdBuffer.back().UserCallback == NULL)
        cmd_count--;
    bool node_open = TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, cmd_count);
    if (draw_list == GetWindowDrawList())
    {
        SameLine();
        TextColored(ImVec4(1.0f, 0.4f, 0.4f, 1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
        if (node_open)
            TreePop();
        return;
    }

    ImDrawList* fg_draw_list = GetForegroundDrawList(window); // Render additional visuals into the top-most draw list
    if (window && IsItemHovered())
        fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
    if (!node_open)
        return;

    if (window && !window->WasActive)
        TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");

    for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.Data; pcmd < draw_list->CmdBuffer.Data + cmd_count; pcmd++)
    {
        if (pcmd->UserCallback)
        {
            BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
            continue;
        }

        char buf[300];
        ImFormatString(buf, IM_ARRAYSIZE(buf), "DrawCmd:%5d tris, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
            pcmd->ElemCount / 3, (void*)(intptr_t)pcmd->TextureId,
            pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
        bool pcmd_node_open = TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "%s", buf);
        if (IsItemHovered() && (cfg->ShowDrawCmdMesh || cfg->ShowDrawCmdBoundingBoxes) && fg_draw_list)
            DebugNodeDrawCmdShowMeshAndBoundingBox(fg_draw_list, draw_list, pcmd, cfg->ShowDrawCmdMesh, cfg->ShowDrawCmdBoundingBoxes);
        if (!pcmd_node_open)
            continue;

        // Calculate approximate coverage area (touched pixel count)
        // This will be in pixels squared as long there's no post-scaling happening to the renderer output.
        const ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
        const ImDrawVert* vtx_buffer = draw_list->VtxBuffer.Data + pcmd->VtxOffset;
        float total_area = 0.0f;
        for (unsigned int idx_n = pcmd->IdxOffset; idx_n < pcmd->IdxOffset + pcmd->ElemCount; )
        {
            ImVec2 triangle[3];
            for (int n = 0; n < 3; n++, idx_n++)
                triangle[n] = vtx_buffer[idx_buffer ? idx_buffer[idx_n] : idx_n].pos;
            total_area += ImTriangleArea(triangle[0], triangle[1], triangle[2]);
        }

        // Display vertex information summary. Hover to get all triangles drawn in wire-frame
        ImFormatString(buf, IM_ARRAYSIZE(buf), "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px", pcmd->ElemCount, pcmd->VtxOffset, pcmd->IdxOffset, total_area);
        Selectable(buf);
        if (IsItemHovered() && fg_draw_list)
            DebugNodeDrawCmdShowMeshAndBoundingBox(fg_draw_list, draw_list, pcmd, true, false);

        // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
        ImGuiListClipper clipper;
        clipper.Begin(pcmd->ElemCount / 3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
        while (clipper.Step())
            for (int prim = clipper.DisplayStart, idx_i = pcmd->IdxOffset + clipper.DisplayStart * 3; prim < clipper.DisplayEnd; prim++)
            {
                char* buf_p = buf, * buf_end = buf + IM_ARRAYSIZE(buf);
                ImVec2 triangle[3];
                for (int n = 0; n < 3; n++, idx_i++)
                {
                    const ImDrawVert& v = vtx_buffer[idx_buffer ? idx_buffer[idx_i] : idx_i];
                    triangle[n] = v.pos;
                    buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                        (n == 0) ? "Vert:" : "     ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                }

                Selectable(buf, false);
                if (fg_draw_list && IsItemHovered())
                {
                    ImDrawListFlags backup_flags = fg_draw_list->Flags;
                    fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
                    fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), true, 1.0f);
                    fg_draw_list->Flags = backup_flags;
                }
            }
        TreePop();
    }
    TreePop();
}